

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

_Bool Hacl_P256_ecdsa_verif_without_hash
                (uint32_t msg_len,uint8_t *msg,uint8_t *public_key,uint8_t *signature_r,
                uint8_t *signature_s)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t t1;
  ulong uVar8;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  uVar1 = *(ulong *)msg;
  uVar2 = *(ulong *)(msg + 8);
  uVar5 = *(ulong *)(msg + 0x10);
  uVar6 = *(ulong *)(msg + 0x18);
  uVar8 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
          (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar7 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar6 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = (ulong)(uVar5 < 0xbce6faada7179e84 ||
                 uVar5 + 0x4319055258e8617c < (ulong)(uVar8 < 0xf3b9cac2fc632551));
  uVar2 = (ulong)(uVar7 != 0xffffffffffffffff || uVar7 + 1 < uVar1);
  uVar4 = FStar_UInt64_eq_mask((ulong)(uVar6 < 0xffffffff00000000 || uVar6 + 0x100000000 < uVar2),0)
  ;
  local_58 = (uVar8 + 0xc46353d039cdaaf ^ uVar8) & uVar4 ^ uVar8;
  local_50 = ((uVar5 + 0x4319055258e8617c) - (ulong)(uVar8 < 0xf3b9cac2fc632551) ^ uVar5) & uVar4 ^
             uVar5;
  local_48 = ((uVar7 + 1) - uVar1 ^ uVar7) & uVar4 ^ uVar7;
  local_40 = ((uVar6 + 0x100000000) - uVar2 ^ uVar6) & uVar4 ^ uVar6;
  _Var3 = ecdsa_verify_msg_as_qelem(&local_58,public_key,signature_r,signature_s);
  return _Var3;
}

Assistant:

bool
Hacl_P256_ecdsa_verif_without_hash(
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  memcpy(mHash, msg, 32U * sizeof (uint8_t));
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_verify_msg_as_qelem(m_q, public_key, signature_r, signature_s);
  return res;
}